

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

Vec3 cross(Vec3 a,Vec3 b)

{
  Vec3 VVar1;
  
  VVar1.z = b.y * a.x - a.y * b.x;
  VVar1.y = b.x * a.z - a.x * b.z;
  VVar1.x = a.y * b.z - b.y * a.z;
  return VVar1;
}

Assistant:

static inline Vec3 cross(Vec3 a, Vec3 b) {
    return (Vec3) {
        a.y * b.z - a.z * b.y,
            a.z * b.x - a.x * b.z,
            a.x * b.y - a.y * b.x,
            };
}